

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsonnetfmt.cpp
# Opt level: O0

void version(ostream *o)

{
  ostream *poVar1;
  char *pcVar2;
  ostream *in_RDI;
  
  poVar1 = std::operator<<(in_RDI,"Jsonnet reformatter ");
  pcVar2 = jsonnet_version();
  poVar1 = std::operator<<(poVar1,pcVar2);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void version(std::ostream &o)
{
    o << "Jsonnet reformatter " << jsonnet_version() << std::endl;
}